

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableSymbols.cpp
# Opt level: O3

void __thiscall
slang::ast::IteratorSymbol::IteratorSymbol
          (IteratorSymbol *this,Scope *scope,string_view name,SourceLocation loc,Type *arrayType,
          string_view indexMethodName)

{
  bitmask<slang::ast::DeclaredTypeFlags> *pbVar1;
  Type *pTVar2;
  
  ValueSymbol::ValueSymbol
            ((ValueSymbol *)this,Iterator,name,loc,(bitmask<slang::ast::DeclaredTypeFlags>)0x0);
  (this->super_TempVarSymbol).super_VariableSymbol.lifetime = Automatic;
  pbVar1 = &(this->super_TempVarSymbol).super_VariableSymbol.super_ValueSymbol.declaredType.flags;
  *(byte *)&pbVar1->m_bits = (byte)pbVar1->m_bits | 0x10;
  (this->super_TempVarSymbol).nextTemp = (TempVarSymbol *)0x0;
  this->arrayType = arrayType;
  (this->indexMethodName)._M_len = indexMethodName._M_len;
  (this->indexMethodName)._M_str = indexMethodName._M_str;
  (this->super_TempVarSymbol).super_VariableSymbol.flags.m_bits = 1;
  (this->super_TempVarSymbol).super_VariableSymbol.super_ValueSymbol.super_Symbol.parentScope =
       scope;
  pTVar2 = Type::getArrayElementType(arrayType);
  if (pTVar2 == (Type *)0x0) {
    pTVar2 = scope->compilation->errorType;
  }
  (this->super_TempVarSymbol).super_VariableSymbol.super_ValueSymbol.declaredType.type = pTVar2;
  return;
}

Assistant:

IteratorSymbol::IteratorSymbol(const Scope& scope, std::string_view name, SourceLocation loc,
                               const Type& arrayType, std::string_view indexMethodName) :
    TempVarSymbol(SymbolKind::Iterator, name, loc, VariableLifetime::Automatic),
    arrayType(arrayType), indexMethodName(indexMethodName) {

    flags |= VariableFlags::Const;
    setParent(scope);

    const Type* elemType = arrayType.getArrayElementType();
    if (!elemType)
        elemType = &scope.getCompilation().getErrorType();

    setType(*elemType);
}